

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_config.c
# Opt level: O2

anytype_t * ps_config_get(ps_config_t *config,char *name)

{
  int32 iVar1;
  anytype_t *in_RAX;
  void *val;
  anytype_t *local_8;
  
  local_8 = in_RAX;
  iVar1 = hash_table_lookup(config->ht,name,&local_8);
  if (iVar1 < 0) {
    local_8 = (anytype_t *)0x0;
  }
  return local_8;
}

Assistant:

const anytype_t *
ps_config_get(ps_config_t *config, const char *name)
{
    void *val;
    if (hash_table_lookup(config->ht, name, &val) < 0)
        return NULL;
    if (val == NULL)
        return NULL;
    return &((cmd_ln_val_t *)val)->val;
}